

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O2

void __thiscall ncnn::Layer::Layer(Layer *this)

{
  this->_vptr_Layer = (_func_int **)&PTR__Layer_00599690;
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  (this->type)._M_string_length = 0;
  (this->type).field_2._M_local_buf[0] = '\0';
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->one_blob_only = false;
  this->support_inplace = false;
  this->support_vulkan = false;
  this->support_packing = false;
  this->support_bf16_storage = false;
  this->support_fp16_storage = false;
  this->support_int8_storage = false;
  this->support_image_storage = false;
  this->support_tensor_storage = false;
  this->support_reserved_00 = false;
  (this->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->bottom_shapes).super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bottom_shapes).super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bottom_shapes).super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->top_shapes).super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->top_shapes).super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->top_shapes).super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->typeindex = -1;
  this->userdata = (void *)0x0;
  return;
}

Assistant:

Layer::Layer()
{
    one_blob_only = false;
    support_inplace = false;
    support_vulkan = false;
    support_packing = false;

    support_bf16_storage = false;
    support_fp16_storage = false;
    support_int8_storage = false;
    support_image_storage = false;
    support_tensor_storage = false;

    support_reserved_00 = false;

    typeindex = -1;

#if NCNN_VULKAN
    vkdev = 0;
#endif // NCNN_VULKAN

    userdata = 0;
}